

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateSizeRange(Result *__return_storage_ptr__,SizeRange *range)

{
  int64 iVar1;
  uint64 uVar2;
  ulong uVar3;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SizeRange *local_18;
  SizeRange *range_local;
  
  local_18 = range;
  range_local = (SizeRange *)__return_storage_ptr__;
  iVar1 = Specification::SizeRange::upperbound(range);
  if (0 < iVar1) {
    uVar2 = Specification::SizeRange::lowerbound(local_18);
    uVar3 = Specification::SizeRange::upperbound(local_18);
    if (uVar3 < uVar2) {
      uVar2 = Specification::SizeRange::lowerbound(local_18);
      std::__cxx11::to_string(&local_b8,uVar2);
      std::operator+(&local_98,"Size range is invalid (",&local_b8);
      std::operator+(&local_78,&local_98,", ");
      iVar1 = Specification::SizeRange::upperbound(local_18);
      std::__cxx11::to_string(&local_e8,iVar1);
      std::operator+(&local_58,&local_78,&local_e8);
      std::operator+(&local_38,&local_58," ).");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      return __return_storage_ptr__;
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateSizeRange(const Specification::SizeRange &range) {
        if (range.upperbound() > 0 && range.lowerbound() > static_cast<unsigned long long>(range.upperbound())) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Size range is invalid (" + std::to_string(range.lowerbound()) + ", " + std::to_string(range.upperbound()) + " ).");
        }
        return Result();
    }